

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gptgen.cpp
# Opt level: O3

int read_mbr(string *drive,uint64_t lba,int block_size,char *buf)

{
  pointer pcVar1;
  int iVar2;
  char *buf_00;
  string local_50;
  
  buf_00 = (char *)operator_new__((long)block_size);
  pcVar1 = (drive->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + drive->_M_string_length);
  iVar2 = read_block(&local_50,lba,block_size,buf_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (-1 < iVar2) {
    memcpy(buf,buf_00,0x1be);
  }
  operator_delete__(buf_00);
  return iVar2;
}

Assistant:

int read_mbr(string drive, uint64_t lba, int block_size, char *buf)
{
	char *tmpbuf = new char[block_size];
	int ret;

	ret = read_block(drive, lba, block_size, tmpbuf);
	if (ret >= 0) memcpy(buf, tmpbuf, 446);
	delete [] tmpbuf;
	return ret;
}